

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

QString * __thiscall QString::setNum(QString *this,qulonglong n,int base)

{
  QString *pQVar1;
  QString *in_RDI;
  long in_FS_OFFSET;
  QString *in_stack_ffffffffffffffa8;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  number((qulonglong)local_20,(int)((ulong)in_RDI >> 0x20));
  pQVar1 = operator=(in_RDI,in_stack_ffffffffffffffa8);
  ~QString((QString *)0x518374);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return pQVar1;
  }
  __stack_chk_fail();
}

Assistant:

QString &QString::setNum(qulonglong n, int base)
{
    return *this = number(n, base);
}